

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laserDriver.h
# Opt level: O2

void publish_scan(rplidar_response_measurement_node_hq_t *nodes,LaserScan *scan_msg,
                 size_t node_count,uint32_t time_start,double scan_time,bool inverted,
                 float angle_min,float angle_max,float max_distance,uint32_t frame_id)

{
  long lVar1;
  float fVar2;
  size_t i;
  size_t sVar3;
  ostream *poVar4;
  _u8 *p_Var5;
  uint uVar6;
  float fVar7;
  uint uVar9;
  undefined1 auVar8 [16];
  double dVar10;
  
  uVar9 = (uint)(angle_max <= angle_min);
  uVar6 = (int)(uVar9 << 0x1f) >> 0x1f;
  uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
  fVar7 = 3.1415927 - (float)(~uVar6 & (uint)angle_min | (uint)angle_max & uVar6);
  fVar2 = 3.1415927 - (float)(~uVar9 & (uint)angle_max | (uint)angle_min & uVar9);
  lVar1 = node_count - 1;
  auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar8._0_8_ = lVar1;
  auVar8._12_4_ = 0x45300000;
  dVar10 = (auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
  scan_msg->angle_min = fVar2;
  scan_msg->angle_max = fVar7;
  scan_msg->angle_increment = (float)((double)(fVar7 - fVar2) / dVar10);
  scan_msg->scan_time = (float)scan_time;
  scan_msg->time_increment = (float)(scan_time / dVar10);
  scan_msg->range_min = 0.15;
  scan_msg->range_max = max_distance;
  if (angle_max <= angle_min == inverted) {
    p_Var5 = &nodes->quality;
    while (node_count != 0) {
      fVar7 = ((float)*(uint *)(p_Var5 + -4) * 0.25) / 1000.0;
      uVar9 = -(uint)(fVar7 == 0.0);
      scan_msg->ranges[node_count - 1] = (float)(~uVar9 & (uint)fVar7 | uVar9 & 0x7f800000);
      scan_msg->intensities[node_count - 1] = (float)(*p_Var5 >> 2);
      p_Var5 = p_Var5 + 8;
      node_count = node_count - 1;
    }
  }
  else {
    for (sVar3 = 0; node_count != sVar3; sVar3 = sVar3 + 1) {
      fVar7 = ((float)nodes[sVar3].dist_mm_q2 * 0.25) / 1000.0;
      uVar9 = -(uint)(fVar7 == 0.0);
      scan_msg->ranges[sVar3] = (float)(uVar9 & 0x7f800000 | ~uVar9 & (uint)fVar7);
      scan_msg->intensities[sVar3] = (float)(nodes[sVar3].quality >> 2);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout," angle_max: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,scan_msg->angle_max);
  poVar4 = std::operator<<(poVar4," angle_min: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,scan_msg->angle_min);
  poVar4 = std::operator<<(poVar4," angle_increment: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,scan_msg->angle_increment);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7c8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,scan_msg->scan_time);
  poVar4 = std::operator<<(poVar4," time_increment: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,scan_msg->time_increment);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void publish_scan( rplidar_response_measurement_node_hq_t *nodes, \
		   slam::sensor::LaserScan &scan_msg,		   
		   size_t node_count, \
		   uint32_t time_start,\
		   double scan_time, bool inverted,\
		   float angle_min, float angle_max,\
		   float max_distance,\
		   uint32_t frame_id )
{
	
	//scan_msg.time_stamp = time_start;
	//scan_msg.frame_id = frame_id;
	
	bool reversed = ( angle_max > angle_min );
	if( reversed ){
		scan_msg.angle_min = M_PI - angle_max;
		scan_msg.angle_max = M_PI - angle_min;
	}	
	else{
		scan_msg.angle_min = M_PI - angle_min;
		scan_msg.angle_max = M_PI - angle_max;
	}
	
	scan_msg.angle_increment = ( scan_msg.angle_max - scan_msg.angle_min ) / (double)( node_count - 1 );
	
	scan_msg.scan_time = scan_time;
	scan_msg.time_increment = scan_time / ( double )( node_count - 1 );
	
	scan_msg.range_min = 0.15;
	scan_msg.range_max = max_distance ;//8.0

	bool reverse_data = ( !inverted && reversed ) || ( inverted && !reversed );
	if( !reverse_data ){
		for( size_t i = 0; i < node_count; i ++ ){
			float read_value = ( float )nodes[i].dist_mm_q2 / 4.0f / 1000;
			if( read_value == 0 ){
				scan_msg.ranges[i] = std::numeric_limits<float>::infinity();
			}
			else{
				scan_msg.ranges[i] = read_value;
			}
			scan_msg.intensities[i] = ( float )( nodes[i].quality >> 2 );
		}
	}
	else{
		for( size_t i = 0; i < node_count; i ++ ){
			float read_value = ( float )nodes[i].dist_mm_q2 / 4.0f / 1000;
			if( read_value == 0 ){
				scan_msg.ranges[ node_count - 1 - i ] = std::numeric_limits<float>::infinity(); 
			}
			else{
				scan_msg.ranges[ node_count - 1 - i ] = read_value;
			}
			scan_msg.intensities[ node_count - 1 - i ] =  ( float )( nodes[i].quality >> 2 );
		}
	}

	/* 打印测试结果 */
	//std::cout << "frame_id: " << scan_msg.frame_id<<std::endl;
	//std::cout << "time_stamp: "<< scan_msg.time_stamp<<std::endl;
	std::cout << " angle_max: " << scan_msg.angle_max << " angle_min: " << scan_msg.angle_min <<" angle_increment: "<<scan_msg.angle_increment<< std::endl;
	std::cout << " scan_time：" << scan_msg.scan_time << " time_increment: " << scan_msg.time_increment << std::endl;
	/*for (size_t i = 0; i < node_count; i++){
		std::cout << "ranges[" << i << "]: " << scan_msg.ranges[i] << std::endl;
	}*/
}